

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream>::
disposeImpl(HeapDisposer<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream> *this,
           void *pointer)

{
  if (pointer != (void *)0x0) {
    NullableValue<kj::Promise<void>_>::~NullableValue
              ((NullableValue<kj::Promise<void>_> *)((long)pointer + 0x18));
    Own<kj::AsyncInputStream,_std::nullptr_t>::dispose
              ((Own<kj::AsyncInputStream,_std::nullptr_t> *)((long)pointer + 8));
    AsyncObject::~AsyncObject((AsyncObject *)pointer);
  }
  operator_delete(pointer,0x28);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }